

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverApi.c
# Opt level: O0

Msat_Solver_t *
Msat_SolverAlloc(int nVarsAlloc,double dClaInc,double dClaDecay,double dVarInc,double dVarDecay,
                int fVerbose)

{
  Msat_Solver_t *pSat;
  Msat_ClauseVec_t *pMVar1;
  double *pdVar2;
  float *pfVar3;
  int *piVar4;
  Msat_Order_t *pMVar5;
  Msat_ClauseVec_t **ppMVar6;
  Msat_Queue_t *pMVar7;
  Msat_IntVec_t *pMVar8;
  Msat_Clause_t **ppMVar9;
  Msat_MmStep_t *pMVar10;
  int local_44;
  int i;
  Msat_Solver_t *p;
  int fVerbose_local;
  double dVarDecay_local;
  double dVarInc_local;
  double dClaDecay_local;
  double dClaInc_local;
  int nVarsAlloc_local;
  
  pSat = (Msat_Solver_t *)malloc(0x148);
  memset(pSat,0,0x148);
  pSat->nVarsAlloc = nVarsAlloc;
  pSat->nVars = 0;
  pSat->nClauses = 0;
  pMVar1 = Msat_ClauseVecAlloc(0x200);
  pSat->vClauses = pMVar1;
  pMVar1 = Msat_ClauseVecAlloc(0x200);
  pSat->vLearned = pMVar1;
  pSat->dClaInc = dClaInc;
  pSat->dClaDecay = dClaDecay;
  pSat->dVarInc = dVarInc;
  pSat->dVarDecay = dVarDecay;
  pdVar2 = (double *)malloc((long)pSat->nVarsAlloc << 3);
  pSat->pdActivity = pdVar2;
  pfVar3 = (float *)malloc((long)pSat->nVarsAlloc << 2);
  pSat->pFactors = pfVar3;
  for (local_44 = 0; local_44 < pSat->nVarsAlloc; local_44 = local_44 + 1) {
    pSat->pdActivity[local_44] = 0.0;
    pSat->pFactors[local_44] = 1.0;
  }
  piVar4 = (int *)malloc((long)pSat->nVarsAlloc << 2);
  pSat->pAssigns = piVar4;
  piVar4 = (int *)malloc((long)pSat->nVarsAlloc << 2);
  pSat->pModel = piVar4;
  for (local_44 = 0; local_44 < pSat->nVarsAlloc; local_44 = local_44 + 1) {
    pSat->pAssigns[local_44] = -1;
  }
  pMVar5 = Msat_OrderAlloc(pSat);
  pSat->pOrder = pMVar5;
  ppMVar6 = (Msat_ClauseVec_t **)malloc((long)(pSat->nVarsAlloc << 1) << 3);
  pSat->pvWatched = ppMVar6;
  for (local_44 = 0; SBORROW4(local_44,pSat->nVarsAlloc * 2) != local_44 + pSat->nVarsAlloc * -2 < 0
      ; local_44 = local_44 + 1) {
    pMVar1 = Msat_ClauseVecAlloc(0x10);
    pSat->pvWatched[local_44] = pMVar1;
  }
  pMVar7 = Msat_QueueAlloc(pSat->nVarsAlloc);
  pSat->pQueue = pMVar7;
  pMVar8 = Msat_IntVecAlloc(pSat->nVarsAlloc);
  pSat->vTrail = pMVar8;
  pMVar8 = Msat_IntVecAlloc(pSat->nVarsAlloc);
  pSat->vTrailLim = pMVar8;
  ppMVar9 = (Msat_Clause_t **)malloc((long)pSat->nVarsAlloc << 3);
  pSat->pReasons = ppMVar9;
  memset(pSat->pReasons,0,(long)pSat->nVarsAlloc << 3);
  piVar4 = (int *)malloc((long)pSat->nVarsAlloc << 2);
  pSat->pLevel = piVar4;
  for (local_44 = 0; local_44 < pSat->nVarsAlloc; local_44 = local_44 + 1) {
    pSat->pLevel[local_44] = -1;
  }
  pSat->dRandSeed = 91648253.0;
  pSat->fVerbose = fVerbose;
  pSat->dProgress = 0.0;
  pMVar10 = Msat_MmStepStart(10);
  pSat->pMem = pMVar10;
  pMVar8 = Msat_IntVecAlloc(pSat->nVarsAlloc);
  pSat->vConeVars = pMVar8;
  pMVar1 = Msat_ClauseVecAlloc(pSat->nVarsAlloc);
  pSat->vAdjacents = pMVar1;
  for (local_44 = 0; local_44 < pSat->nVarsAlloc; local_44 = local_44 + 1) {
    pMVar1 = pSat->vAdjacents;
    pMVar8 = Msat_IntVecAlloc(5);
    Msat_ClauseVecPush(pMVar1,(Msat_Clause_t *)pMVar8);
  }
  pMVar8 = Msat_IntVecAlloc(pSat->nVarsAlloc);
  pSat->vVarsUsed = pMVar8;
  Msat_IntVecFill(pSat->vVarsUsed,pSat->nVarsAlloc,1);
  piVar4 = (int *)malloc((long)pSat->nVarsAlloc << 2);
  pSat->pSeen = piVar4;
  memset(pSat->pSeen,0,(long)pSat->nVarsAlloc << 2);
  pSat->nSeenId = 1;
  pMVar8 = Msat_IntVecAlloc(pSat->nVarsAlloc);
  pSat->vReason = pMVar8;
  pMVar8 = Msat_IntVecAlloc(pSat->nVarsAlloc);
  pSat->vTemp = pMVar8;
  return pSat;
}

Assistant:

Msat_Solver_t * Msat_SolverAlloc( int nVarsAlloc,
    double dClaInc, double dClaDecay, 
    double dVarInc, double dVarDecay, 
    int  fVerbose )
{
    Msat_Solver_t * p;
    int i;

    assert(sizeof(Msat_Lit_t) == sizeof(unsigned));
    assert(sizeof(float)     == sizeof(unsigned));

    p = ABC_ALLOC( Msat_Solver_t, 1 );
    memset( p, 0, sizeof(Msat_Solver_t) );

    p->nVarsAlloc = nVarsAlloc;
    p->nVars     = 0;

    p->nClauses  = 0;
    p->vClauses  = Msat_ClauseVecAlloc( 512 );
    p->vLearned  = Msat_ClauseVecAlloc( 512 );

    p->dClaInc   = dClaInc;
    p->dClaDecay = dClaDecay;
    p->dVarInc   = dVarInc;
    p->dVarDecay = dVarDecay;

    p->pdActivity = ABC_ALLOC( double, p->nVarsAlloc );
    p->pFactors   = ABC_ALLOC( float, p->nVarsAlloc );
    for ( i = 0; i < p->nVarsAlloc; i++ )
    {
        p->pdActivity[i] = 0.0;
        p->pFactors[i]   = 1.0;
    }

    p->pAssigns  = ABC_ALLOC( int, p->nVarsAlloc ); 
    p->pModel    = ABC_ALLOC( int, p->nVarsAlloc ); 
    for ( i = 0; i < p->nVarsAlloc; i++ )
        p->pAssigns[i] = MSAT_VAR_UNASSIGNED;
//    p->pOrder    = Msat_OrderAlloc( p->pAssigns, p->pdActivity, p->nVarsAlloc );
    p->pOrder    = Msat_OrderAlloc( p );

    p->pvWatched = ABC_ALLOC( Msat_ClauseVec_t *, 2 * p->nVarsAlloc );
    for ( i = 0; i < 2 * p->nVarsAlloc; i++ )
        p->pvWatched[i] = Msat_ClauseVecAlloc( 16 );
    p->pQueue    = Msat_QueueAlloc( p->nVarsAlloc );

    p->vTrail    = Msat_IntVecAlloc( p->nVarsAlloc );
    p->vTrailLim = Msat_IntVecAlloc( p->nVarsAlloc );
    p->pReasons  = ABC_ALLOC( Msat_Clause_t *, p->nVarsAlloc );
    memset( p->pReasons, 0, sizeof(Msat_Clause_t *) * p->nVarsAlloc );
    p->pLevel = ABC_ALLOC( int, p->nVarsAlloc );
    for ( i = 0; i < p->nVarsAlloc; i++ )
        p->pLevel[i] = -1;
    p->dRandSeed = 91648253;
    p->fVerbose  = fVerbose;
    p->dProgress = 0.0;
//    p->pModel = Msat_IntVecAlloc( p->nVarsAlloc );
    p->pMem = Msat_MmStepStart( 10 );

    p->vConeVars   = Msat_IntVecAlloc( p->nVarsAlloc ); 
    p->vAdjacents  = Msat_ClauseVecAlloc( p->nVarsAlloc );
    for ( i = 0; i < p->nVarsAlloc; i++ )
        Msat_ClauseVecPush( p->vAdjacents, (Msat_Clause_t *)Msat_IntVecAlloc(5) );
    p->vVarsUsed   = Msat_IntVecAlloc( p->nVarsAlloc ); 
    Msat_IntVecFill( p->vVarsUsed, p->nVarsAlloc, 1 );


    p->pSeen     = ABC_ALLOC( int, p->nVarsAlloc );
    memset( p->pSeen, 0, sizeof(int) * p->nVarsAlloc );
    p->nSeenId   = 1;
    p->vReason   = Msat_IntVecAlloc( p->nVarsAlloc );
    p->vTemp     = Msat_IntVecAlloc( p->nVarsAlloc );
    return p;
}